

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<pybind11::detail::value_and_holder&,std::__cxx11::string_const&>::
load_impl_sequence<0ul,1ul>
          (argument_loader<pybind11::detail::value_and_holder&,std::__cxx11::string_const&> *this,
          long call)

{
  char *pcVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  bool bVar5;
  char local_1;
  
  puVar3 = *(undefined8 **)(call + 8);
  uVar2 = **(uint **)(call + 0x20);
  *(undefined8 *)(this + 0x20) = *puVar3;
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          *)this,(PyObject *)puVar3[1],SUB41((uVar2 & 2) >> 1,0));
  lVar4 = 0;
  do {
    bVar5 = lVar4 == 1;
    if (bVar5) {
      return bVar5;
    }
    pcVar1 = &local_1 + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pcVar1 != '\0');
  return bVar5;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }